

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void in2_a2(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  TCGv_i64 pTVar2;
  int x2;
  
  uVar1 = (s->fields).presentO;
  x2 = 0;
  if ((uVar1 >> 0xe & 1) != 0) {
    x2 = (s->fields).c[6];
  }
  if (((uVar1 >> 9 & 1) != 0) && ((uVar1 >> 0xc & 1) != 0)) {
    pTVar2 = get_address(s,x2,(s->fields).c[1],(s->fields).c[5]);
    o->in2 = pTVar2;
    return;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static void in2_a2(DisasContext *s, DisasOps *o)
{
    int x2 = have_field(s, x2) ? get_field(s, x2) : 0;
    o->in2 = get_address(s, x2, get_field(s, b2), get_field(s, d2));
}